

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

void checkobject(global_State *g,GCObject *o,int maybedead,int listage)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  GCObject *pGVar7;
  GCObject *pGVar8;
  uint uVar9;
  GCObject *pGVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  TValue *pTVar14;
  long lVar15;
  TValue *t;
  TValue *pTVar16;
  Value local_38;
  ushort local_30;
  
  bVar5 = o->marked;
  if (((g->currentwhite ^ 0x18) & bVar5) == 0) {
    if (((bVar5 & 0x18) == 0) && (g->gcstate == '\b')) {
      __assert_fail("g->gcstate != 8 || (((o)->marked) & (((1<<(3)) | (1<<(4)))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x19e,"void checkobject(global_State *, GCObject *, int, int)");
    }
    if (g->gckind == '\x01') {
      uVar9 = bVar5 & 7;
      if ((int)uVar9 < listage) {
        __assert_fail("((o)->marked & 7) >= listage",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a0,"void checkobject(global_State *, GCObject *, int, int)");
      }
      if (1 < uVar9 && (bVar5 & 0x18) != 0) {
        __assert_fail("!(((o)->marked) & (((1<<(3)) | (1<<(4))))) || !(((o)->marked & 7) > 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a1,"void checkobject(global_State *, GCObject *, int, int)");
      }
      if (((((bVar5 & 0x20) == 0 && 1 < uVar9) && (uVar9 != 2)) && (uVar9 != 5)) && (o->tt != '\b'))
      {
        __assert_fail("(((o)->marked) & ((1<<(5)))) || ((o)->marked & 7) == 5 || ((o)->marked & 7) == 2 || o->tt == 8"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a7,"void checkobject(global_State *, GCObject *, int, int)");
      }
    }
    switch(o->tt) {
    case '\x04':
    case '\x14':
      if ((bVar5 & 0x38) == 0) {
        __assert_fail("!(!(((o)->marked) & (((1<<(3)) | (1<<(4))) | (1<<(5)))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x186,"void checkrefs(global_State *, GCObject *)");
      }
      break;
    case '\x05':
      pGVar7 = *(GCObject **)&o[2].tt;
      pTVar14 = (TValue *)((long)(1 << ((byte)o->field_0xb & 0x1f)) * 0x20 + *(long *)&o[1].tt);
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((h->metatable)->tt) & 0x0F) < (9+1)";
LAB_0014c7e2:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x103,"void checktable(global_State *, Table *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_0014c7e2;
        }
      }
      if (*(int *)&o->field_0xc != 0) {
        lVar13 = 0;
        uVar12 = 0;
        do {
          checkvalref(g,o,(TValue *)((long)&(o[1].next)->next + lVar13));
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0x10;
        } while (uVar12 < *(uint *)&o->field_0xc);
      }
      if (*(TValue **)&o[1].tt < pTVar14) {
        t = *(TValue **)&o[1].tt + 1;
        do {
          if (t[-1].tt_ != 0) {
            if (t->tt_ == 0) {
              __assert_fail("!((((((const TValue*)((&(n)->i_key.tvk)))))->tt_) == (0))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x108,"void checktable(global_State *, Table *)");
            }
            checkvalref(g,o,t);
            checkvalref(g,o,t + -1);
          }
          pTVar16 = t + 1;
          t = t + 2;
        } while (pTVar16 < pTVar14);
      }
      break;
    case '\x06':
      pGVar7 = *(GCObject **)&o[1].tt;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((cl->p)->tt) & 0x0F) < (9+1)";
LAB_0014c7a4:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x13b,"void checkLclosure(global_State *, LClosure *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_0014c7a4;
        }
      }
      bVar5 = o->field_0xa;
      if (bVar5 != 0) {
        uVar12 = 0;
        do {
          pGVar7 = (&o[2].next)[uVar12];
          if (pGVar7 != (GCObject *)0x0) {
            if (pGVar7->next == pGVar7 + 1) {
              checkvalref(g,o,(TValue *)pGVar7->next);
            }
            iVar3._0_1_ = pGVar7->tt;
            iVar3._1_1_ = pGVar7->marked;
            iVar3._2_2_ = *(undefined2 *)&pGVar7->field_0xa;
            if (iVar3 == 0) {
              __assert_fail("uv->refcount > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x141,"void checkLclosure(global_State *, LClosure *)");
            }
            bVar5 = o->field_0xa;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < bVar5);
      }
      break;
    case '\a':
      pGVar7 = o[1].next;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((mt)->tt) & 0x0F) < (9+1)";
LAB_0014c801:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x114,"void checkudata(global_State *, Udata *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_0014c801;
        }
      }
      local_38 = (Value)((Value *)(o + 2))->gc;
      local_30 = *(ushort *)&o->field_0xa;
      if (((short)local_30 < 0) &&
         (((local_30 & 0x7f) != (ushort)(local_38.gc)->tt ||
          ((g->mainthread != (lua_State *)0x0 &&
           (((local_38.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)))))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x115,"void checkudata(global_State *, Udata *)");
      }
      checkvalref(g,o,(TValue *)&local_38);
      break;
    case '\b':
      pGVar7 = *(GCObject **)&o[3].tt;
      if (pGVar7 == (GCObject *)0x0) {
        iVar6._0_1_ = o[0xb].tt;
        iVar6._1_1_ = o[0xb].marked;
        iVar6._2_2_ = *(undefined2 *)&o[0xb].field_0xa;
        if (((iVar6 != 0) || (o[4].next != (GCObject *)0x0)) || (o[2].next != (GCObject *)0x0)) {
          __assert_fail("L1->stacksize == 0 && L1->openupval == ((void*)0) && L1->ci == ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x15c,"void checkstack(global_State *, lua_State *)");
        }
      }
      else {
        pGVar8 = o + 4;
        while (pGVar10 = pGVar8->next, pGVar10 != (GCObject *)0x0) {
          pGVar8 = pGVar10 + 1;
          if (pGVar10->next == pGVar8) {
            __assert_fail("((uv)->v != &(uv)->u.value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x160,"void checkstack(global_State *, lua_State *)");
          }
        }
        for (pGVar8 = o[2].next; pGVar8 != (GCObject *)0x0; pGVar8 = pGVar8[1].next) {
          if (o[3].next < *(GCObject **)&pGVar8->tt) {
            __assert_fail("ci->top <= L1->stack_last",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x162,"void checkstack(global_State *, lua_State *)");
          }
          if ((((ulong)pGVar8[4].next & 0x20000) != 0) &&
             (*(char *)((long)&pGVar8[4].next + 6) == '\0')) {
            if ((o[2].next == pGVar8) && (o->field_0xa == '\x01')) {
              pGVar10 = (GCObject *)((long)&pGVar7->next + *(long *)&pGVar8[3].tt);
            }
            else {
              pGVar10 = pGVar8->next;
            }
            sVar1._0_1_ = pGVar10->tt;
            sVar1._1_1_ = pGVar10->marked;
            if (sVar1 != -0x7ffa) {
              pcVar11 = "((((f))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_0014c723:
              __assert_fail(pcVar11,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x14e,"int lua_checkpc(lua_State *, CallInfo *)");
            }
            if (pGVar10->next->tt != '\x06') {
              pcVar11 = "(((f)->value_).gc)->tt == ((6) | ((0) << 4))";
              goto LAB_0014c723;
            }
            lVar13 = *(long *)&pGVar10->next[1].tt;
            uVar12._0_1_ = pGVar8[2].tt;
            uVar12._1_1_ = pGVar8[2].marked;
            uVar12._2_6_ = *(undefined6 *)&pGVar8[2].field_0xa;
            uVar4 = *(ulong *)(lVar13 + 0x38);
            if ((uVar12 < uVar4) || (uVar4 + (long)*(int *)(lVar13 + 0x18) * 4 < uVar12)) {
              __assert_fail("lua_checkpc(L1, ci)",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x163,"void checkstack(global_State *, lua_State *)");
            }
          }
        }
        for (; pGVar7 < o[3].next + 5; pGVar7 = pGVar7 + 1) {
          uVar2._0_1_ = pGVar7->tt;
          uVar2._1_1_ = pGVar7->marked;
          if (((short)uVar2 < 0) &&
             (((uVar2 & 0x7f) != (ushort)pGVar7->next->tt ||
              ((pGVar7->next->marked & (*(byte *)(*(long *)&o[1].tt + 0x54) ^ 0x18)) != 0)))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x166,"void checkstack(global_State *, lua_State *)");
          }
        }
      }
      break;
    case '\t':
      pGVar7 = o[6].next;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((f->cache)->tt) & 0x0F) < (9+1)";
LAB_0014c7c3:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x120,"void checkproto(global_State *, Proto *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_0014c7c3;
        }
      }
      pGVar7 = *(GCObject **)&o[6].tt;
      if (pGVar7 != (GCObject *)0x0) {
        if (9 < (pGVar7->tt & 0xe)) {
          pcVar11 = "(((f->source)->tt) & 0x0F) < (9+1)";
LAB_0014c829:
          __assert_fail(pcVar11,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x121,"void checkproto(global_State *, Proto *)");
        }
        iVar6 = testobjref(g,o,pGVar7);
        if (iVar6 == 0) {
          pcVar11 = "0";
          goto LAB_0014c829;
        }
      }
      iVar6 = *(int *)((long)&o[1].next + 4);
      if (0 < iVar6) {
        lVar15 = 8;
        lVar13 = 0;
        do {
          if ((*(ushort *)((long)&(o[3].next)->next + lVar15) & 0xf) == 4) {
            pGVar7 = *(GCObject **)((long)o[3].next + lVar15 + -8);
            if ((pGVar7->tt & 0xf) != 4) {
              pcVar11 = "(((((f->k + i)->value_).gc)->tt) & 0x0F) == 4";
LAB_0014c660:
              __assert_fail(pcVar11,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x124,"void checkproto(global_State *, Proto *)");
            }
            iVar6 = testobjref(g,o,pGVar7);
            if (iVar6 == 0) {
              pcVar11 = "0";
              goto LAB_0014c660;
            }
            iVar6 = *(int *)((long)&o[1].next + 4);
          }
          lVar13 = lVar13 + 1;
          lVar15 = lVar15 + 0x10;
        } while (lVar13 < iVar6);
      }
      iVar6 = *(int *)&o[1].next;
      if (0 < iVar6) {
        lVar15 = 0;
        lVar13 = 0;
        do {
          pGVar7 = *(GCObject **)(*(long *)&o[5].tt + lVar15);
          if (pGVar7 != (GCObject *)0x0) {
            if (9 < (pGVar7->tt & 0xe)) {
              pcVar11 = "(((f->upvalues[i].name)->tt) & 0x0F) < (9+1)";
LAB_0014c5aa:
              __assert_fail(pcVar11,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x127,"void checkproto(global_State *, Proto *)");
            }
            iVar6 = testobjref(g,o,pGVar7);
            if (iVar6 == 0) {
              pcVar11 = "0";
              goto LAB_0014c5aa;
            }
            iVar6 = *(int *)&o[1].next;
          }
          lVar13 = lVar13 + 1;
          lVar15 = lVar15 + 0x18;
        } while (lVar13 < iVar6);
      }
      iVar6 = *(int *)&o[2].next;
      if (0 < iVar6) {
        lVar13 = 0;
        do {
          pGVar7 = (&(o[4].next)->next)[lVar13];
          if (pGVar7 != (GCObject *)0x0) {
            if (9 < (pGVar7->tt & 0xe)) {
              pcVar11 = "(((f->p[i])->tt) & 0x0F) < (9+1)";
LAB_0014c5f1:
              __assert_fail(pcVar11,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x129,"void checkproto(global_State *, Proto *)");
            }
            iVar6 = testobjref(g,o,pGVar7);
            if (iVar6 == 0) {
              pcVar11 = "0";
              goto LAB_0014c5f1;
            }
            iVar6 = *(int *)&o[2].next;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < iVar6);
      }
      iVar6 = *(int *)((long)&o[2].next + 4);
      if (0 < iVar6) {
        lVar15 = 0;
        lVar13 = 0;
        do {
          pGVar7 = *(GCObject **)((long)&(o[5].next)->next + lVar15);
          if (pGVar7 != (GCObject *)0x0) {
            if (9 < (pGVar7->tt & 0xe)) {
              pcVar11 = "(((f->locvars[i].varname)->tt) & 0x0F) < (9+1)";
LAB_0014c619:
              __assert_fail(pcVar11,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,299,"void checkproto(global_State *, Proto *)");
            }
            iVar6 = testobjref(g,o,pGVar7);
            if (iVar6 == 0) {
              pcVar11 = "0";
              goto LAB_0014c619;
            }
            iVar6 = *(int *)((long)&o[2].next + 4);
          }
          lVar13 = lVar13 + 1;
          lVar15 = lVar15 + 0x20;
        } while (lVar13 < iVar6);
      }
      break;
    case '\n':
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
    case '\x13':
switchD_0014c05d_caseD_a:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x189,"void checkrefs(global_State *, GCObject *)");
    default:
      if (o->tt != '&') goto switchD_0014c05d_caseD_a;
      if (o->field_0xa != '\0') {
        pGVar7 = o + 2;
        uVar12 = 0;
        do {
          checkvalref(g,o,(TValue *)pGVar7);
          uVar12 = uVar12 + 1;
          pGVar7 = pGVar7 + 1;
        } while (uVar12 < (byte)o->field_0xa);
      }
    }
  }
  else if (maybedead == 0) {
    __assert_fail("maybedead",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x19c,"void checkobject(global_State *, GCObject *, int, int)");
  }
  return;
}

Assistant:

static void checkobject (global_State *g, GCObject *o, int maybedead,
                         int listage) {
  if (isdead(g, o))
    lua_assert(maybedead);
  else {
    lua_assert(g->gcstate != GCSpause || iswhite(o));
    if (g->gckind == KGC_GEN) {  /* generational mode? */
      lua_assert(getage(o) >= listage);
      lua_assert(!iswhite(o) || !isold(o));
      if (isold(o)) {
        lua_assert(isblack(o) ||
        getage(o) == G_TOUCHED1 ||
        getage(o) == G_OLD0 ||
        o->tt == LUA_TTHREAD /* ||
        (o->tt == LUA_TUPVAL && upisopen(gco2upv(o)))*/);
      }
    }
    checkrefs(g, o);
  }
}